

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O3

void __thiscall leveldb::DBTest_IterSingle_Test::TestBody(DBTest_IterSingle_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  undefined1 *puVar3;
  PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> PVar4;
  int iVar5;
  undefined4 extraout_var;
  char *pcVar6;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  undefined1 *local_a0;
  undefined4 uStack_98;
  undefined4 uStack_94;
  undefined1 local_90 [16];
  string local_80;
  AssertHelper local_60;
  undefined8 *puStack_58;
  undefined1 local_49;
  void *local_48;
  AssertionResult local_40;
  Iterator *iter;
  
  paVar1 = &local_80.field_2;
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"a","");
  local_a0 = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"va","");
  puVar3 = local_a0;
  local_49 = 0;
  local_60.data_ = (AssertHelperData *)local_80._M_dataplus._M_p;
  puStack_58 = (undefined8 *)local_80._M_string_length;
  local_40.success_ = (bool)local_a0._0_1_;
  local_40._1_3_ = local_a0._1_3_;
  local_40._4_4_ = local_a0._4_4_;
  local_40.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = uStack_98;
  local_40.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = uStack_94;
  local_a0 = puVar3;
  (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_48);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_60,
             &local_40.success_,(Status *)"Put(\"a\", \"va\")");
  if (local_48 != (void *)0x0) {
    operator_delete__(local_48);
  }
  if ((AssertHelperData *)local_a0 != (AssertHelperData *)local_90) {
    operator_delete(local_a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  PVar4 = local_60.data_._0_1_;
  if (local_60.data_._0_1_ == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (puStack_58 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*puStack_58;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
               ,0x317,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_80._M_dataplus._M_p + 8))();
    }
  }
  puVar2 = puStack_58;
  if (puStack_58 != (undefined8 *)0x0) {
    if ((undefined8 *)*puStack_58 != puStack_58 + 2) {
      operator_delete((undefined8 *)*puStack_58);
    }
    operator_delete(puVar2);
  }
  if (PVar4 != (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
    local_80._M_string_length = 0;
    local_80._M_dataplus._M_p = (pointer)0x100;
    iVar5 = (*((this->super_DBTest).db_)->_vptr_DB[6])();
    iter = (Iterator *)CONCAT44(extraout_var,iVar5);
    (*iter->_vptr_Iterator[3])(iter);
    DBTest::IterStatus_abi_cxx11_(&local_80,&this->super_DBTest,iter);
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
              ((internal *)&local_a0,"IterStatus(iter)","\"a->va\"",&local_80,(char (*) [6])"a->va")
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if (local_a0._0_1_ == (string)0x0) {
      testing::Message::Message((Message *)&local_80);
      if ((undefined8 *)CONCAT44(uStack_94,uStack_98) == (undefined8 *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)CONCAT44(uStack_94,uStack_98);
      }
      iVar5 = 0x31b;
    }
    else {
      puVar2 = (undefined8 *)CONCAT44(uStack_94,uStack_98);
      if (puVar2 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar2 != puVar2 + 2) {
          operator_delete((undefined8 *)*puVar2);
        }
        operator_delete(puVar2);
      }
      (*iter->_vptr_Iterator[6])(iter);
      DBTest::IterStatus_abi_cxx11_(&local_80,&this->super_DBTest,iter);
      testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
                ((internal *)&local_a0,"IterStatus(iter)","\"(invalid)\"",&local_80,
                 (char (*) [10])"(invalid)");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar1) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      if (local_a0._0_1_ == (string)0x0) {
        testing::Message::Message((Message *)&local_80);
        if ((undefined8 *)CONCAT44(uStack_94,uStack_98) == (undefined8 *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = *(char **)CONCAT44(uStack_94,uStack_98);
        }
        iVar5 = 0x31d;
      }
      else {
        puVar2 = (undefined8 *)CONCAT44(uStack_94,uStack_98);
        if (puVar2 != (undefined8 *)0x0) {
          if ((undefined8 *)*puVar2 != puVar2 + 2) {
            operator_delete((undefined8 *)*puVar2);
          }
          operator_delete(puVar2);
        }
        (*iter->_vptr_Iterator[3])(iter);
        DBTest::IterStatus_abi_cxx11_(&local_80,&this->super_DBTest,iter);
        testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
                  ((internal *)&local_a0,"IterStatus(iter)","\"a->va\"",&local_80,
                   (char (*) [6])"a->va");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar1) {
          operator_delete(local_80._M_dataplus._M_p);
        }
        if (local_a0._0_1_ == (string)0x0) {
          testing::Message::Message((Message *)&local_80);
          if ((undefined8 *)CONCAT44(uStack_94,uStack_98) == (undefined8 *)0x0) {
            pcVar6 = "";
          }
          else {
            pcVar6 = *(char **)CONCAT44(uStack_94,uStack_98);
          }
          iVar5 = 799;
        }
        else {
          puVar2 = (undefined8 *)CONCAT44(uStack_94,uStack_98);
          if (puVar2 != (undefined8 *)0x0) {
            if ((undefined8 *)*puVar2 != puVar2 + 2) {
              operator_delete((undefined8 *)*puVar2);
            }
            operator_delete(puVar2);
          }
          (*iter->_vptr_Iterator[7])(iter);
          DBTest::IterStatus_abi_cxx11_(&local_80,&this->super_DBTest,iter);
          testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
                    ((internal *)&local_a0,"IterStatus(iter)","\"(invalid)\"",&local_80,
                     (char (*) [10])"(invalid)");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != paVar1) {
            operator_delete(local_80._M_dataplus._M_p);
          }
          if (local_a0._0_1_ != (string)0x0) {
            puVar2 = (undefined8 *)CONCAT44(uStack_94,uStack_98);
            if (puVar2 != (undefined8 *)0x0) {
              if ((undefined8 *)*puVar2 != puVar2 + 2) {
                operator_delete((undefined8 *)*puVar2);
              }
              operator_delete(puVar2);
            }
            (*iter->_vptr_Iterator[4])(iter);
            DBTest::IterStatus_abi_cxx11_(&local_80,&this->super_DBTest,iter);
            testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
                      ((internal *)&local_a0,"IterStatus(iter)","\"a->va\"",&local_80,
                       (char (*) [6])"a->va");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != paVar1) {
              operator_delete(local_80._M_dataplus._M_p);
            }
            if (local_a0._0_1_ == (string)0x0) {
              testing::Message::Message((Message *)&local_80);
              if ((undefined8 *)CONCAT44(uStack_94,uStack_98) == (undefined8 *)0x0) {
                pcVar6 = "";
              }
              else {
                pcVar6 = *(char **)CONCAT44(uStack_94,uStack_98);
              }
              iVar5 = 0x324;
            }
            else {
              testing::AssertionResult::~AssertionResult((AssertionResult *)&local_a0);
              (*iter->_vptr_Iterator[6])(iter);
              DBTest::IterStatus_abi_cxx11_(&local_80,&this->super_DBTest,iter);
              testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
                        ((internal *)&local_a0,"IterStatus(iter)","\"(invalid)\"",&local_80,
                         (char (*) [10])"(invalid)");
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80._M_dataplus._M_p != paVar1) {
                operator_delete(local_80._M_dataplus._M_p);
              }
              if (local_a0._0_1_ == (string)0x0) {
                testing::Message::Message((Message *)&local_80);
                if ((undefined8 *)CONCAT44(uStack_94,uStack_98) == (undefined8 *)0x0) {
                  pcVar6 = "";
                }
                else {
                  pcVar6 = *(char **)CONCAT44(uStack_94,uStack_98);
                }
                iVar5 = 0x326;
              }
              else {
                testing::AssertionResult::~AssertionResult((AssertionResult *)&local_a0);
                (*iter->_vptr_Iterator[4])(iter);
                DBTest::IterStatus_abi_cxx11_(&local_80,&this->super_DBTest,iter);
                testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
                          ((internal *)&local_a0,"IterStatus(iter)","\"a->va\"",&local_80,
                           (char (*) [6])"a->va");
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_80._M_dataplus._M_p != paVar1) {
                  operator_delete(local_80._M_dataplus._M_p);
                }
                if (local_a0._0_1_ == (string)0x0) {
                  testing::Message::Message((Message *)&local_80);
                  if ((undefined8 *)CONCAT44(uStack_94,uStack_98) == (undefined8 *)0x0) {
                    pcVar6 = "";
                  }
                  else {
                    pcVar6 = *(char **)CONCAT44(uStack_94,uStack_98);
                  }
                  iVar5 = 0x328;
                }
                else {
                  testing::AssertionResult::~AssertionResult((AssertionResult *)&local_a0);
                  (*iter->_vptr_Iterator[7])(iter);
                  DBTest::IterStatus_abi_cxx11_(&local_80,&this->super_DBTest,iter);
                  testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
                            ((internal *)&local_a0,"IterStatus(iter)","\"(invalid)\"",&local_80,
                             (char (*) [10])"(invalid)");
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_80._M_dataplus._M_p != paVar1) {
                    operator_delete(local_80._M_dataplus._M_p);
                  }
                  if (local_a0._0_1_ == (string)0x0) {
                    testing::Message::Message((Message *)&local_80);
                    if ((undefined8 *)CONCAT44(uStack_94,uStack_98) == (undefined8 *)0x0) {
                      pcVar6 = "";
                    }
                    else {
                      pcVar6 = *(char **)CONCAT44(uStack_94,uStack_98);
                    }
                    iVar5 = 0x32a;
                  }
                  else {
                    testing::AssertionResult::~AssertionResult((AssertionResult *)&local_a0);
                    pcVar6 = "";
                    local_80._M_dataplus._M_p = "";
                    local_80._M_string_length = 0;
                    (*iter->_vptr_Iterator[5])(iter);
                    DBTest::IterStatus_abi_cxx11_(&local_80,&this->super_DBTest,iter);
                    testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
                              ((internal *)&local_a0,"IterStatus(iter)","\"a->va\"",&local_80,
                               (char (*) [6])"a->va");
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_80._M_dataplus._M_p != paVar1) {
                      operator_delete(local_80._M_dataplus._M_p);
                    }
                    if (local_a0._0_1_ == (string)0x0) {
                      testing::Message::Message((Message *)&local_80);
                      if ((undefined8 *)CONCAT44(uStack_94,uStack_98) != (undefined8 *)0x0) {
                        pcVar6 = *(char **)CONCAT44(uStack_94,uStack_98);
                      }
                      iVar5 = 0x32d;
                    }
                    else {
                      testing::AssertionResult::~AssertionResult((AssertionResult *)&local_a0);
                      (*iter->_vptr_Iterator[6])(iter);
                      DBTest::IterStatus_abi_cxx11_(&local_80,&this->super_DBTest,iter);
                      testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
                                ((internal *)&local_a0,"IterStatus(iter)","\"(invalid)\"",&local_80,
                                 (char (*) [10])"(invalid)");
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_80._M_dataplus._M_p != paVar1) {
                        operator_delete(local_80._M_dataplus._M_p);
                      }
                      if (local_a0._0_1_ == (string)0x0) {
                        testing::Message::Message((Message *)&local_80);
                        if ((undefined8 *)CONCAT44(uStack_94,uStack_98) == (undefined8 *)0x0) {
                          pcVar6 = "";
                        }
                        else {
                          pcVar6 = *(char **)CONCAT44(uStack_94,uStack_98);
                        }
                        iVar5 = 0x32f;
                      }
                      else {
                        testing::AssertionResult::~AssertionResult((AssertionResult *)&local_a0);
                        local_80._M_dataplus._M_p = "a";
                        local_80._M_string_length = 1;
                        (*iter->_vptr_Iterator[5])(iter);
                        DBTest::IterStatus_abi_cxx11_(&local_80,&this->super_DBTest,iter);
                        testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
                                  ((internal *)&local_a0,"IterStatus(iter)","\"a->va\"",&local_80,
                                   (char (*) [6])"a->va");
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_80._M_dataplus._M_p != paVar1) {
                          operator_delete(local_80._M_dataplus._M_p);
                        }
                        if (local_a0._0_1_ == (string)0x0) {
                          testing::Message::Message((Message *)&local_80);
                          if ((undefined8 *)CONCAT44(uStack_94,uStack_98) == (undefined8 *)0x0) {
                            pcVar6 = "";
                          }
                          else {
                            pcVar6 = *(char **)CONCAT44(uStack_94,uStack_98);
                          }
                          iVar5 = 0x332;
                        }
                        else {
                          testing::AssertionResult::~AssertionResult((AssertionResult *)&local_a0);
                          (*iter->_vptr_Iterator[6])(iter);
                          DBTest::IterStatus_abi_cxx11_(&local_80,&this->super_DBTest,iter);
                          testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
                                    ((internal *)&local_a0,"IterStatus(iter)","\"(invalid)\"",
                                     &local_80,(char (*) [10])"(invalid)");
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_80._M_dataplus._M_p != paVar1) {
                            operator_delete(local_80._M_dataplus._M_p);
                          }
                          if (local_a0._0_1_ == (string)0x0) {
                            testing::Message::Message((Message *)&local_80);
                            if ((undefined8 *)CONCAT44(uStack_94,uStack_98) == (undefined8 *)0x0) {
                              pcVar6 = "";
                            }
                            else {
                              pcVar6 = *(char **)CONCAT44(uStack_94,uStack_98);
                            }
                            iVar5 = 0x334;
                          }
                          else {
                            testing::AssertionResult::~AssertionResult((AssertionResult *)&local_a0)
                            ;
                            local_80._M_dataplus._M_p = "b";
                            local_80._M_string_length = 1;
                            (*iter->_vptr_Iterator[5])(iter);
                            DBTest::IterStatus_abi_cxx11_(&local_80,&this->super_DBTest,iter);
                            testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
                                      ((internal *)&local_a0,"IterStatus(iter)","\"(invalid)\"",
                                       &local_80,(char (*) [10])"(invalid)");
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_80._M_dataplus._M_p != paVar1) {
                              operator_delete(local_80._M_dataplus._M_p);
                            }
                            if (local_a0._0_1_ != (string)0x0) {
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)&local_a0);
                              (*iter->_vptr_Iterator[1])(iter);
                              return;
                            }
                            testing::Message::Message((Message *)&local_80);
                            if ((undefined8 *)CONCAT44(uStack_94,uStack_98) == (undefined8 *)0x0) {
                              pcVar6 = "";
                            }
                            else {
                              pcVar6 = *(char **)CONCAT44(uStack_94,uStack_98);
                            }
                            iVar5 = 0x337;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_60,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                       ,iVar5,pcVar6);
            testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_80);
            testing::internal::AssertHelper::~AssertHelper(&local_60);
            if ((long *)local_80._M_dataplus._M_p != (long *)0x0) {
              (**(code **)(*(long *)local_80._M_dataplus._M_p + 8))();
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)&local_a0);
            return;
          }
          testing::Message::Message((Message *)&local_80);
          if ((undefined8 *)CONCAT44(uStack_94,uStack_98) == (undefined8 *)0x0) {
            pcVar6 = "";
          }
          else {
            pcVar6 = *(char **)CONCAT44(uStack_94,uStack_98);
          }
          iVar5 = 0x321;
        }
      }
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
               ,iVar5,pcVar6);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((long *)local_80._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_80._M_dataplus._M_p + 8))();
    }
    puVar2 = (undefined8 *)CONCAT44(uStack_94,uStack_98);
    if (puVar2 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar2 != puVar2 + 2) {
        operator_delete((undefined8 *)*puVar2);
      }
      operator_delete(puVar2);
    }
  }
  return;
}

Assistant:

TEST_F(DBTest, IterSingle) {
  ASSERT_LEVELDB_OK(Put("a", "va"));
  Iterator* iter = db_->NewIterator(ReadOptions());

  iter->SeekToFirst();
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "(invalid)");
  iter->SeekToFirst();
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "(invalid)");

  iter->SeekToLast();
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "(invalid)");
  iter->SeekToLast();
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "(invalid)");

  iter->Seek("");
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "(invalid)");

  iter->Seek("a");
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "(invalid)");

  iter->Seek("b");
  ASSERT_EQ(IterStatus(iter), "(invalid)");

  delete iter;
}